

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipcmp.c
# Opt level: O0

int ef_order(void *ap,void *bp)

{
  ef *b;
  ef *a;
  void *bp_local;
  void *ap_local;
  
  if (*(short *)((long)ap + 8) == *(short *)((long)bp + 8)) {
    if (*(short *)((long)ap + 10) == *(short *)((long)bp + 10)) {
      if (*(short *)((long)ap + 0xc) == *(short *)((long)bp + 0xc)) {
        ap_local._4_4_ =
             memcmp(*(void **)((long)ap + 0x10),*(void **)((long)bp + 0x10),
                    (ulong)*(ushort *)((long)ap + 0xc));
      }
      else {
        ap_local._4_4_ = (uint)*(ushort *)((long)ap + 0xc) - (uint)*(ushort *)((long)bp + 0xc);
      }
    }
    else {
      ap_local._4_4_ = (uint)*(ushort *)((long)ap + 10) - (uint)*(ushort *)((long)bp + 10);
    }
  }
  else {
    ap_local._4_4_ = (uint)*(ushort *)((long)ap + 8) - (uint)*(ushort *)((long)bp + 8);
  }
  return ap_local._4_4_;
}

Assistant:

static int
ef_order(const void *ap, const void *bp) {
    const struct ef *a, *b;

    a = (struct ef *)ap;
    b = (struct ef *)bp;

    if (a->flags != b->flags)
	return a->flags - b->flags;
    if (a->id != b->id)
	return a->id - b->id;
    if (a->size != b->size)
	return a->size - b->size;
    return memcmp(a->data, b->data, a->size);
}